

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDHostExit(int statusCode)

{
  JsErrorCode JVar1;
  int local_c [2];
  int statusCode_local;
  
  local_c[0] = statusCode;
  JVar1 = ContextAPIWrapper<false,JsTTDHostExit::__0>((anon_class_8_1_ac38f2bd)local_c);
  return JVar1;
}

Assistant:

CHAKRA_API JsTTDHostExit(_In_ int statusCode)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHostExitProcess, statusCode);

        return JsNoError;
    });
#endif
}